

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

EntryType * __thiscall
JsUtil::
BaseDictionary<int,_JsUtil::BaseHashSet<Js::JitIndexedPropertyGuard_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::JitIndexedPropertyGuard_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::AllocateEntries(BaseDictionary<int,_JsUtil::BaseHashSet<Js::JitIndexedPropertyGuard_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::JitIndexedPropertyGuard_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *this,int size,bool zeroAllocate)

{
  Type this_00;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_01;
  SimpleDictionaryEntry<int,_JsUtil::BaseHashSet<Js::JitIndexedPropertyGuard_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::JitIndexedPropertyGuard_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_*>
  *pSVar1;
  offset_in_JitArenaAllocator_to_subr extraout_RDX;
  offset_in_JitArenaAllocator_to_subr extraout_RDX_00;
  JitArenaAllocator *local_70;
  offset_in_JitArenaAllocator_to_subr local_68;
  TrackAllocData local_40;
  byte local_15;
  int local_14;
  bool zeroAllocate_local;
  BaseDictionary<int,_JsUtil::BaseHashSet<Js::JitIndexedPropertyGuard_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::JitIndexedPropertyGuard_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBStack_10;
  int size_local;
  BaseDictionary<int,_JsUtil::BaseHashSet<Js::JitIndexedPropertyGuard_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::JitIndexedPropertyGuard_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  this_00 = this->alloc;
  local_15 = zeroAllocate;
  local_14 = size;
  pBStack_10 = this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,
             (type_info *)
             &SimpleDictionaryEntry<int,JsUtil::BaseHashSet<Js::JitIndexedPropertyGuard*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::JitIndexedPropertyGuard*,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>*>
              ::typeinfo,0,(long)size,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
             ,0x453);
  this_01 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                           this_00,&local_40);
  if ((local_15 & 1) == 0) {
    local_70 = (JitArenaAllocator *)
               Memory::
               TypeAllocatorFunc<Memory::JitArenaAllocator,_JsUtil::BaseHashSet<Js::JitIndexedPropertyGuard_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::JitIndexedPropertyGuard_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_*>
               ::GetAllocFunc();
    local_68 = extraout_RDX_00;
  }
  else {
    local_70 = (JitArenaAllocator *)
               Memory::
               TypeAllocatorFunc<Memory::JitArenaAllocator,_JsUtil::BaseHashSet<Js::JitIndexedPropertyGuard_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::JitIndexedPropertyGuard_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_*>
               ::GetAllocZeroFunc();
    local_68 = extraout_RDX;
  }
  pSVar1 = Memory::
           AllocateArray<Memory::JitArenaAllocator,JsUtil::SimpleDictionaryEntry<int,JsUtil::BaseHashSet<Js::JitIndexedPropertyGuard*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::JitIndexedPropertyGuard*,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>*>,false>
                     ((Memory *)this_01,local_70,local_68,(long)local_14);
  return pSVar1;
}

Assistant:

EntryType * AllocateEntries(DECLSPEC_GUARD_OVERFLOW int size, const bool zeroAllocate = true)
        {
            // Note that the choice of leaf/non-leaf node is decided for the EntryType on the basis of TValue. By default, if
            // TValue is a pointer, a non-leaf allocation is done. This behavior can be overridden by specializing
            // TypeAllocatorFunc for TValue.
            return
                AllocateArray<AllocatorType, EntryType, false>(
                    TRACK_ALLOC_INFO(alloc, EntryType, AllocatorType, 0, size),
                    zeroAllocate ? EntryAllocatorFuncType::GetAllocZeroFunc() : EntryAllocatorFuncType::GetAllocFunc(),
                    size);
        }